

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxConditional::Resolve(FxConditional *this,FCompileContext *ctx)

{
  FxExpression **ppFVar1;
  FxExpression **ppFVar2;
  BYTE BVar3;
  FxExpression *pFVar4;
  PPointer *pPVar5;
  PString *pPVar6;
  PType *pPVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PFloat **ppPVar9;
  FxBoolCast *this_00;
  FxExpression *pFVar10;
  FxFloatCast *pFVar11;
  FxExpression **ppFVar12;
  FScriptPosition *other;
  PPointer *pPVar13;
  PPointer *pPVar14;
  FxExpression **ppFVar15;
  ExpVal condval;
  FString local_38;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar10 = this->condition;
  if (pFVar10 != (FxExpression *)0x0) {
    iVar8 = (*pFVar10->_vptr_FxExpression[2])(pFVar10,ctx);
    this->condition = (FxExpression *)CONCAT44(extraout_var,iVar8);
  }
  ppFVar1 = &this->truex;
  pFVar10 = this->truex;
  if (pFVar10 != (FxExpression *)0x0) {
    iVar8 = (*pFVar10->_vptr_FxExpression[2])(pFVar10,ctx);
    *ppFVar1 = (FxExpression *)CONCAT44(extraout_var_00,iVar8);
  }
  ppFVar2 = &this->falsex;
  pFVar10 = this->falsex;
  if (pFVar10 == (FxExpression *)0x0) {
    pFVar10 = (FxExpression *)0x0;
  }
  else {
    iVar8 = (*pFVar10->_vptr_FxExpression[2])(pFVar10,ctx);
    pFVar10 = (FxExpression *)CONCAT44(extraout_var_01,iVar8);
    *ppFVar2 = pFVar10;
  }
  if (((this->condition == (FxExpression *)0x0) ||
      (pFVar4 = *ppFVar1, pFVar4 == (FxExpression *)0x0)) || (pFVar10 == (FxExpression *)0x0))
  goto LAB_0052b684;
  pPVar14 = (PPointer *)pFVar4->ValueType;
  if (pPVar14 != (PPointer *)pFVar10->ValueType) {
    iVar8 = (*(pPVar14->super_PBasicType).super_PType.super_PTypeBase.super_DObject._vptr_DObject[8]
            )();
    if (((char)iVar8 == '\0') || (pFVar4->ValueType->RegType != '\0')) {
LAB_0052b50d:
      iVar8 = (*((*ppFVar1)->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
      if (((char)iVar8 == '\0') ||
         (iVar8 = (*((*ppFVar2)->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])(),
         (char)iVar8 == '\0')) {
        pPVar14 = (PPointer *)(*ppFVar1)->ValueType;
        pPVar5 = (PPointer *)(*ppFVar2)->ValueType;
        if ((pPVar14->super_PBasicType).super_PType.RegType != '\x03' || pPVar5 != TypeNullPtr) {
          pPVar13 = pPVar5;
          if (pPVar14 != TypeNullPtr) {
            pPVar13 = (PPointer *)TypeVoid;
          }
          pPVar14 = pPVar13;
          if ((pPVar5->super_PBasicType).super_PType.RegType != '\x03') {
            pPVar14 = (PPointer *)TypeVoid;
          }
        }
        goto LAB_0052b586;
      }
      ppPVar9 = &TypeFloat64;
    }
    else {
      pFVar10 = *ppFVar2;
      iVar8 = (*(pFVar10->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
      if (((char)iVar8 == '\0') || (pFVar10->ValueType->RegType != '\0')) goto LAB_0052b50d;
      ppPVar9 = (PFloat **)&TypeSInt32;
    }
    pPVar14 = (PPointer *)*ppPVar9;
  }
LAB_0052b586:
  (this->super_FxExpression).ValueType = (PType *)pPVar14;
  pFVar10 = this->condition;
  if (pFVar10->ValueType != (PType *)TypeBool) {
    this_00 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar10 = this->condition;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&(this_00->super_FxExpression).ScriptPosition,&pFVar10->ScriptPosition);
    (this_00->super_FxExpression).isresolved = false;
    (this_00->super_FxExpression).NeedResult = true;
    (this_00->super_FxExpression).ExprType = EFX_BoolCast;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070b548;
    this_00->basex = pFVar10;
    (this_00->super_FxExpression).ValueType = (PType *)TypeBool;
    this_00->NeedValue = true;
    this->condition = (FxExpression *)this_00;
    pFVar10 = FxBoolCast::Resolve(this_00,ctx);
    this->condition = pFVar10;
    if (pFVar10 == (FxExpression *)0x0) {
LAB_0052b684:
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return (FxExpression *)0x0;
    }
  }
  iVar8 = (*pFVar10->_vptr_FxExpression[3])();
  if ((char)iVar8 == '\0') {
    pPVar7 = (this->super_FxExpression).ValueType;
    if (pPVar7->RegType != '\x01') {
      return &this->super_FxExpression;
    }
    if (pPVar7->RegCount != '\x01') {
      return &this->super_FxExpression;
    }
    if ((*ppFVar1)->ValueType->RegType != '\x01') {
      pFVar11 = (FxFloatCast *)FMemArena::Alloc(&FxAlloc,0x30);
      pFVar10 = *ppFVar1;
      (pFVar11->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
      FScriptPosition::FScriptPosition
                (&(pFVar11->super_FxExpression).ScriptPosition,&pFVar10->ScriptPosition);
      (pFVar11->super_FxExpression).isresolved = false;
      (pFVar11->super_FxExpression).NeedResult = true;
      (pFVar11->super_FxExpression).ExprType = EFX_FloatCast;
      (pFVar11->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxFloatCast_0070b618;
      pFVar11->basex = pFVar10;
      (pFVar11->super_FxExpression).ValueType = (PType *)TypeFloat64;
      *ppFVar1 = (FxExpression *)pFVar11;
      pFVar10 = FxFloatCast::Resolve(pFVar11,ctx);
      *ppFVar1 = pFVar10;
    }
    if ((*ppFVar2)->ValueType->RegType == '\x01') {
      return &this->super_FxExpression;
    }
    pFVar11 = (FxFloatCast *)FMemArena::Alloc(&FxAlloc,0x30);
    pFVar10 = *ppFVar2;
    (pFVar11->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&(pFVar11->super_FxExpression).ScriptPosition,&pFVar10->ScriptPosition);
    (pFVar11->super_FxExpression).isresolved = false;
    (pFVar11->super_FxExpression).NeedResult = true;
    (pFVar11->super_FxExpression).ExprType = EFX_FloatCast;
    (pFVar11->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxFloatCast_0070b618;
    pFVar11->basex = pFVar10;
    (pFVar11->super_FxExpression).ValueType = (PType *)TypeFloat64;
    *ppFVar2 = (FxExpression *)pFVar11;
    pFVar10 = FxFloatCast::Resolve(pFVar11,ctx);
    *ppFVar2 = pFVar10;
    return &this->super_FxExpression;
  }
  pPVar6 = (PString *)this->condition[1]._vptr_FxExpression;
  other = &this->condition[1].ScriptPosition;
  if (pPVar6 == TypeString) {
    FString::AttachToOther(&local_38,&other->FileName);
  }
  else {
    local_38.Chars = (other->FileName).Chars;
  }
  BVar3 = (pPVar6->super_PBasicType).super_PType.RegType;
  ppFVar12 = ppFVar2;
  ppFVar15 = ppFVar1;
  if (BVar3 == '\x01') {
    if (((double)local_38.Chars == 0.0) && (!NAN((double)local_38.Chars))) goto LAB_0052b7f7;
  }
  else if ((BVar3 != '\0') || ((int)local_38.Chars == 0)) goto LAB_0052b7f7;
  ppFVar12 = ppFVar1;
  ppFVar15 = ppFVar2;
LAB_0052b7f7:
  pFVar10 = *ppFVar12;
  if (*ppFVar15 != (FxExpression *)0x0) {
    (*(*ppFVar15)->_vptr_FxExpression[1])();
  }
  *ppFVar1 = (FxExpression *)0x0;
  this->falsex = (FxExpression *)0x0;
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  if (pPVar6 == TypeString) {
    FString::~FString(&local_38);
  }
  return pFVar10;
}

Assistant:

FxExpression *FxConditional::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(condition, ctx);
	RESOLVE(truex, ctx);
	RESOLVE(falsex, ctx);
	ABORT(condition && truex && falsex);

	if (truex->ValueType == falsex->ValueType)
		ValueType = truex->ValueType;
	else if (truex->ValueType == TypeBool && falsex->ValueType == TypeBool)
		ValueType = TypeBool;
	else if (truex->IsInteger() && falsex->IsInteger())
		ValueType = TypeSInt32;
	else if (truex->IsNumeric() && falsex->IsNumeric())
		ValueType = TypeFloat64;
	else if (truex->IsPointer() && falsex->ValueType == TypeNullPtr)
		ValueType = truex->ValueType;
	else if (falsex->IsPointer() && truex->ValueType == TypeNullPtr)
		ValueType = falsex->ValueType;
	else
		ValueType = TypeVoid;
	//else if (truex->ValueType != falsex->ValueType)

	if (ValueType->GetRegType() == REGT_NIL)
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible types for ?: operator");
		delete this;
		return nullptr;
	}

	if (condition->ValueType != TypeBool)
	{
		condition = new FxBoolCast(condition);
		SAFE_RESOLVE(condition, ctx);
	}

	if (condition->isConstant())
	{
		ExpVal condval = static_cast<FxConstant *>(condition)->GetValue();
		bool result = condval.GetBool();

		FxExpression *e = result? truex:falsex;
		delete (result? falsex:truex);
		falsex = truex = nullptr;
		delete this;
		return e;
	}

	if (IsFloat())
	{
		if (truex->ValueType->GetRegType() != REGT_FLOAT)
		{
			truex = new FxFloatCast(truex);
			RESOLVE(truex, ctx);
		}
		if (falsex->ValueType->GetRegType() != REGT_FLOAT)
		{
			falsex = new FxFloatCast(falsex);
			RESOLVE(falsex, ctx);
		}
	}

	return this;
}